

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stun_msg.c
# Opt level: O0

void stun_attr_errcode_init(stun_attr_errcode *attr,int err_code,char *err_reason,uint8_t pad)

{
  ushort length;
  size_t sVar1;
  uint16_t attr_len;
  uint8_t *p;
  int reason_len;
  uint8_t pad_local;
  char *err_reason_local;
  int err_code_local;
  stun_attr_errcode *attr_local;
  
  sVar1 = strlen(err_reason);
  length = (short)sVar1 + 4;
  stun_attr_hdr_init(&attr->hdr,9,length);
  attr->unused = 0;
  attr->err_class = (uint8_t)((long)err_code / 100);
  attr->err_code = (uint8_t)(err_code % 100);
  memcpy(attr->err_reason,err_reason,(long)(int)sVar1);
  store_padding((uint8_t *)(attr->err_reason + (long)(int)(uint)length + -4),(ulong)length,pad);
  return;
}

Assistant:

void stun_attr_errcode_init(stun_attr_errcode *attr, int err_code,
                            const char *err_reason, uint8_t pad) {
  int reason_len = strlen(err_reason);
  uint8_t *p = (uint8_t *)attr;
  uint16_t attr_len = (uint16_t)(sizeof(attr->unused)
      + sizeof(attr->err_class) + sizeof(attr->err_code) + reason_len);
  stun_attr_hdr_init(&attr->hdr, STUN_ATTR_ERROR_CODE, attr_len);
  attr->unused = 0;
  attr->err_class = (uint8_t)(err_code / 100);
  attr->err_code = err_code % 100;
  memcpy(attr->err_reason, err_reason, reason_len);
  store_padding(p + sizeof(attr->hdr) + attr_len, attr_len, pad);
}